

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::name_formatter::format
          (name_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  bool bVar1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest_00;
  undefined1 auVar2 [16];
  string_view_t sVar3;
  string_view_t view;
  undefined1 local_50 [8];
  scoped_pad p;
  memory_buffer *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  name_formatter *this_local;
  
  p.spaces_._M_str = (char *)dest;
  bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
  if (bVar1) {
    sVar3 = (string_view_t)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)msg->logger_name);
    dest_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
              &(this->super_flag_formatter).padinfo_;
    scoped_pad::scoped_pad
              ((scoped_pad *)local_50,sVar3,(padding_info *)dest_00,
               (memory_buffer *)p.spaces_._M_str);
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)msg->logger_name);
    sVar3._M_str = p.spaces_._M_str;
    sVar3._M_len = auVar2._8_8_;
    fmt_helper::append_string_view<500ul>(auVar2._0_8_,sVar3,dest_00);
    scoped_pad::~scoped_pad((scoped_pad *)local_50);
  }
  else {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)msg->logger_name);
    view._M_str = p.spaces_._M_str;
    view._M_len = auVar2._8_8_;
    fmt_helper::append_string_view<500ul>(auVar2._0_8_,view,dest);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            scoped_pad p(*msg.logger_name, padinfo_, dest);
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(*msg.logger_name, dest);
        }
    }